

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_filename sqlite3_db_filename(sqlite3 *db,char *zDbName)

{
  Btree *pBVar1;
  sqlite3 *in_RSI;
  Btree *pBt;
  char *local_20;
  
  pBVar1 = sqlite3DbNameToBtree(in_RSI,&DAT_aaaaaaaaaaaaaaaa);
  if (pBVar1 == (Btree *)0x0) {
    local_20 = (char *)0x0;
  }
  else {
    local_20 = sqlite3BtreeGetFilename((Btree *)0x151a17);
  }
  return local_20;
}

Assistant:

SQLITE_API const char *sqlite3_db_filename(sqlite3 *db, const char *zDbName){
  Btree *pBt;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  pBt = sqlite3DbNameToBtree(db, zDbName);
  return pBt ? sqlite3BtreeGetFilename(pBt) : 0;
}